

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::dht_put_alert::dht_put_alert
          (dht_put_alert *this,stack_allocator *param_1,array<char,_32UL> *key,
          array<char,_64UL> *sig,string *s,int64_t sequence_number,int n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  rep rVar11;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_004dc310;
  rVar11 = ::std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar11;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_put_alert_004dd5f8;
  (this->target).m_number._M_elems[0] = 0;
  (this->target).m_number._M_elems[1] = 0;
  (this->target).m_number._M_elems[2] = 0;
  (this->target).m_number._M_elems[3] = 0;
  (this->target).m_number._M_elems[4] = 0;
  uVar4 = *(undefined8 *)(key->_M_elems + 8);
  uVar5 = *(undefined8 *)(key->_M_elems + 0x10);
  uVar6 = *(undefined8 *)(key->_M_elems + 0x18);
  *(undefined8 *)(this->public_key)._M_elems = *(undefined8 *)key->_M_elems;
  *(undefined8 *)((this->public_key)._M_elems + 8) = uVar4;
  *(undefined8 *)((this->public_key)._M_elems + 0x10) = uVar5;
  *(undefined8 *)((this->public_key)._M_elems + 0x18) = uVar6;
  uVar4 = *(undefined8 *)sig->_M_elems;
  uVar5 = *(undefined8 *)(sig->_M_elems + 8);
  uVar6 = *(undefined8 *)(sig->_M_elems + 0x10);
  uVar7 = *(undefined8 *)(sig->_M_elems + 0x18);
  uVar8 = *(undefined8 *)(sig->_M_elems + 0x20);
  uVar9 = *(undefined8 *)(sig->_M_elems + 0x28);
  uVar10 = *(undefined8 *)(sig->_M_elems + 0x38);
  *(undefined8 *)((this->signature)._M_elems + 0x30) = *(undefined8 *)(sig->_M_elems + 0x30);
  *(undefined8 *)((this->signature)._M_elems + 0x38) = uVar10;
  *(undefined8 *)((this->signature)._M_elems + 0x20) = uVar8;
  *(undefined8 *)((this->signature)._M_elems + 0x28) = uVar9;
  *(undefined8 *)((this->signature)._M_elems + 0x10) = uVar6;
  *(undefined8 *)((this->signature)._M_elems + 0x18) = uVar7;
  *(undefined8 *)(this->signature)._M_elems = uVar4;
  *(undefined8 *)((this->signature)._M_elems + 8) = uVar5;
  paVar2 = &(this->salt).field_2;
  (this->salt)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&s->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->salt).field_2 + 8) = uVar4;
  }
  else {
    (this->salt)._M_dataplus._M_p = pcVar3;
    (this->salt).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->salt)._M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  this->seq = sequence_number;
  this->num_success = n;
  return;
}

Assistant:

dht_put_alert::dht_put_alert(aux::stack_allocator&
		, std::array<char, 32> const& key
		, std::array<char, 64> const& sig
		, std::string s
		, std::int64_t sequence_number
		, int n)
		: target(nullptr)
		, public_key(key)
		, signature(sig)
		, salt(std::move(s))
		, seq(sequence_number)
		, num_success(n)
	{}